

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCodewordDecoder.cpp
# Opt level: O3

int ZXing::Pdf417::CodewordDecoder::GetDecodedValue(array<int,_8UL> *moduleBitCount)

{
  int *piVar1;
  int iVar2;
  size_t i_1;
  long lVar3;
  long lVar4;
  int i;
  int iVar5;
  int iVar6;
  long lVar7;
  anon_class_1_0_00000001 *this;
  int iVar8;
  ulong uVar9;
  vector<std::array<float,_8UL>,_std::allocator<std::array<float,_8UL>_>_> *__return_storage_ptr__;
  uint symbol;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  ModuleBitCountType result;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  local_28 = (undefined1  [16])0x0;
  local_38 = (undefined1  [16])0x0;
  fVar10 = (float)(moduleBitCount->_M_elems[7] + moduleBitCount->_M_elems[3] +
                   moduleBitCount->_M_elems[5] + moduleBitCount->_M_elems[1] +
                  moduleBitCount->_M_elems[6] + moduleBitCount->_M_elems[2] +
                  moduleBitCount->_M_elems[4] + moduleBitCount->_M_elems[0]);
  iVar2 = 0;
  iVar5 = 0;
  iVar6 = 0;
  do {
    this = (anon_class_1_0_00000001 *)(long)iVar2;
    iVar8 = moduleBitCount->_M_elems[(long)this] + iVar6;
    if ((float)iVar8 <= ((float)iVar5 * fVar10) / 17.0 + fVar10 / 34.0) {
      iVar2 = iVar2 + 1;
      if (iVar2 == 8) break;
      this = (anon_class_1_0_00000001 *)(long)iVar2;
      iVar6 = iVar8;
    }
    *(int *)(local_38 + (long)this * 4) = *(int *)(local_38 + (long)this * 4) + 1;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x11);
  lVar3 = 0;
  symbol = 0;
  do {
    iVar6 = *(int *)(local_38 + lVar3 * 4);
    if (0 < iVar6) {
      do {
        symbol = ((uint)lVar3 & 1) + symbol * 2 ^ 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  iVar6 = GetCodeword(symbol);
  if (symbol == 0xffffffff || iVar6 == -1) {
    if (GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable == '\0') {
      __return_storage_ptr__ =
           (vector<std::array<float,_8UL>,_std::allocator<std::array<float,_8UL>_>_> *)
           &GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable;
      iVar6 = __cxa_guard_acquire();
      if (iVar6 != 0) {
        GetClosestDecodedValue::anon_class_1_0_00000001::operator()(__return_storage_ptr__,this);
        __cxa_atexit(std::vector<std::array<float,_8UL>,_std::allocator<std::array<float,_8UL>_>_>::
                     ~vector,&GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable,
                     &__dso_handle);
        __cxa_guard_release();
      }
    }
    iVar6 = moduleBitCount->_M_elems[7] + moduleBitCount->_M_elems[3] +
            moduleBitCount->_M_elems[5] + moduleBitCount->_M_elems[1] +
            moduleBitCount->_M_elems[6] + moduleBitCount->_M_elems[2] +
            moduleBitCount->_M_elems[4] + moduleBitCount->_M_elems[0];
    local_28 = (undefined1  [16])0x0;
    local_38 = (undefined1  [16])0x0;
    if (1 < iVar6) {
      auVar11._0_4_ = (float)iVar6;
      auVar11._4_4_ = auVar11._0_4_;
      auVar11._8_4_ = auVar11._0_4_;
      auVar11._12_4_ = auVar11._0_4_;
      lVar3 = 0;
      do {
        piVar1 = moduleBitCount->_M_elems + lVar3;
        auVar14._0_4_ = (float)*piVar1;
        auVar14._4_4_ = (float)piVar1[1];
        auVar14._8_4_ = (float)piVar1[2];
        auVar14._12_4_ = (float)piVar1[3];
        auVar14 = divps(auVar14,auVar11);
        *(undefined1 (*) [16])(local_38 + lVar3 * 4) = auVar14;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
    }
    if (DAT_001f9f08 - GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable == 0) {
      symbol = 0xffffffff;
    }
    else {
      lVar4 = DAT_001f9f08 - GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable >> 5;
      symbol = 0xffffffff;
      fVar10 = 3.4028235e+38;
      lVar7 = 0;
      lVar3 = GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable;
      do {
        fVar13 = 0.0;
        uVar9 = 0;
        do {
          fVar12 = *(float *)(lVar3 + uVar9 * 4) - *(float *)(local_38 + uVar9 * 4);
          fVar13 = fVar12 * fVar12 + fVar13;
          if (6 < uVar9) break;
          uVar9 = uVar9 + 1;
        } while (fVar13 < fVar10);
        if (fVar13 < fVar10) {
          symbol = (ushort)(&SYMBOL_TABLE)[(int)lVar7] | 0x10000;
          fVar10 = fVar13;
        }
        lVar7 = lVar7 + 1;
        lVar3 = lVar3 + 0x20;
      } while (lVar7 != lVar4 + (ulong)(lVar4 == 0));
    }
  }
  return symbol;
}

Assistant:

int
CodewordDecoder::GetDecodedValue(const std::array<int, BARS_IN_MODULE>& moduleBitCount)
{
	int decodedValue = GetDecodedCodewordValue(SampleBitCounts(moduleBitCount));
	if (decodedValue != -1) {
		return decodedValue;
	}
	return GetClosestDecodedValue(moduleBitCount);
}